

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::exportToFile(Board *this,ofstream *outputFile)

{
  ostream *poVar1;
  char cVar2;
  pointer pBVar3;
  
  for (pBVar3 = (this->blocks).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                super__Vector_impl_data._M_start;
      pBVar3 != (this->blocks).super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                super__Vector_impl_data._M_finish; pBVar3 = pBVar3 + 1) {
    cVar2 = 'v';
    if (pBVar3->direction == 0) {
      cVar2 = 'h';
    }
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)outputFile,pBVar3->row + 1);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pBVar3->column + 1);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pBVar3->length);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,cVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void Board::exportToFile(std::ofstream &outputFile) {
    char direction;

    // Iterate over the blocks and write to the given output file.
    for (vector<Block>::iterator it = this->blocks.begin(); it != this->blocks.end(); it++) {
        if (it->direction == HORIZONTAL) {
            direction = 'h';
        } else {
            direction = 'v';
        }

        outputFile << it->row + 1 << " " << it->column + 1 << " " << it->length << " " << direction << endl;
    }
}